

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_filter.cpp
# Opt level: O2

ssize_t __thiscall ParticleFilter::write(ParticleFilter *this,int __fd,void *__buf,size_t __n)

{
  ostream *poVar1;
  ssize_t sVar2;
  uint i;
  ulong uVar3;
  long lVar4;
  ofstream dataFile;
  
  std::ofstream::ofstream((string *)&dataFile);
  std::ofstream::open((string *)&dataFile,__fd);
  lVar4 = 0;
  for (uVar3 = 0; uVar3 < this->num_particles; uVar3 = uVar3 + 1) {
    poVar1 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)&((this->particles).
                                  super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
                                  super__Vector_impl_data._M_start)->x + lVar4));
    std::operator<<(poVar1," ");
    poVar1 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)&((this->particles).
                                  super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
                                  super__Vector_impl_data._M_start)->y + lVar4));
    std::operator<<(poVar1," ");
    poVar1 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)&((this->particles).
                                  super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
                                  super__Vector_impl_data._M_start)->theta + lVar4));
    std::operator<<(poVar1,"\n");
    lVar4 = lVar4 + 0x28;
  }
  std::ofstream::close();
  sVar2 = std::ofstream::~ofstream(&dataFile);
  return sVar2;
}

Assistant:

void ParticleFilter::write(std::string filename) const {
	// You don't need to modify this file.
	std::ofstream dataFile;
	dataFile.open(filename, std::ios::app);
	for (unsigned int i = 0; i < num_particles; ++i) {
		dataFile << particles[i].x << " " << particles[i].y << " " << particles[i].theta << "\n";
	}
	dataFile.close();
}